

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

void __thiscall
jbcoin::STAmount::STAmount
          (STAmount *this,SField *name,void *issue,mantissa_type mantissa,exponent_type exponent,
          byte native,byte negative)

{
  bool negative_local;
  bool native_local;
  exponent_type exponent_local;
  mantissa_type mantissa_local;
  Issue *issue_local;
  SField *name_local;
  STAmount *this_local;
  
  STBase::STBase(&this->super_STBase,name);
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STAmount_00519e68;
  memcpy(&this->mIssue,issue,0x28);
  this->mValue = mantissa;
  this->mOffset = exponent;
  this->mIsNative = (bool)(native & 1);
  this->mIsNegative = (bool)(negative & 1);
  return;
}

Assistant:

STAmount::STAmount (SField const& name, Issue const& issue,
        mantissa_type mantissa, exponent_type exponent,
            bool native, bool negative, unchecked)
    : STBase (name)
    , mIssue (issue)
    , mValue (mantissa)
    , mOffset (exponent)
    , mIsNative (native)
    , mIsNegative (negative)
{
}